

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_opengl.h
# Opt level: O0

djg_mesh * djgm_load_cone(int slices,int stacks)

{
  float fVar1;
  float fVar2;
  djg_mesh *pdVar3;
  djgm_vertex *pdVar4;
  float fVar5;
  double dVar6;
  float nrm;
  float z;
  float phi;
  djgm_vertex *v;
  int j;
  int i;
  djg_mesh *mesh;
  int stacks_local;
  int slices_local;
  
  pdVar3 = djgm_load_plane(slices,stacks);
  for (v._4_4_ = 0; v._4_4_ < slices + 2; v._4_4_ = v._4_4_ + 1) {
    for (v._0_4_ = 0; (int)v < stacks + 2; v._0_4_ = (int)v + 1) {
      pdVar4 = pdVar3->vertexv + (v._4_4_ * (stacks + 2) + (int)v);
      fVar2 = (pdVar4->st).s * 2.0 * 3.1415927;
      fVar1 = (pdVar4->st).t;
      dVar6 = std::sqrt(5.30498947741318e-315);
      fVar5 = SUB84(dVar6,0) / 2.0;
      dVar6 = std::cos((double)(ulong)(uint)fVar2);
      (pdVar4->p).x = SUB84(dVar6,0) * (pdVar4->st).t;
      dVar6 = std::sin((double)(ulong)(uint)fVar2);
      (pdVar4->p).y = SUB84(dVar6,0) * (pdVar4->st).t;
      (pdVar4->p).z = fVar1 + fVar1 + -1.0;
      dVar6 = std::sin((double)(ulong)(uint)fVar2);
      (pdVar4->dpds).x = -SUB84(dVar6,0);
      dVar6 = std::cos((double)(ulong)(uint)fVar2);
      (pdVar4->dpds).y = SUB84(dVar6,0);
      (pdVar4->dpds).z = 0.0;
      dVar6 = std::cos((double)(ulong)(uint)fVar2);
      (pdVar4->dpdt).x = SUB84(dVar6,0) * fVar5;
      dVar6 = std::sin((double)(ulong)(uint)fVar2);
      (pdVar4->dpdt).y = SUB84(dVar6,0) * fVar5;
      (pdVar4->dpdt).z = fVar5;
    }
  }
  return pdVar3;
}

Assistant:

DJGDEF djg_mesh *
djgm_load_cone(int slices, int stacks)
{
    djg_mesh *mesh = djgm_load_plane(slices, stacks);;
    int i, j;

    slices+= 2;
    stacks+= 2;

    for (i = 0; i < slices; ++i)
    for (j = 0; j < stacks; ++j) {
        djgm_vertex *v = &mesh->vertexv[i * stacks + j];
        float phi = v->st.s * 2 * M_PI;
        float z = 2 * v->st.t - 1;
        float nrm = sqrt(2.f) / 2.f;

        v->p.x = cos(phi)* v->st.t;
        v->p.y = sin(phi)* v->st.t;
        v->p.z = z;

        v->dpds.x = -sin(phi);
        v->dpds.y = +cos(phi);
        v->dpds.z = 0;

        v->dpdt.x = cos(phi) * nrm;
        v->dpdt.y = sin(phi) * nrm;
        v->dpdt.z = nrm;
    }

    return mesh;
}